

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O3

int VP8GetHeaders(VP8Decoder *dec,VP8Io *io)

{
  VP8BitReader *br;
  int iVar1;
  byte bVar2;
  uint3 *puVar3;
  uint3 uVar4;
  int8_t iVar5;
  uint8_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar10;
  VP8StatusCode VVar11;
  char *pcVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  byte bVar16;
  int iVar17;
  byte *start;
  long lVar18;
  ulong uVar19;
  int32_t iVar9;
  
  if (dec == (VP8Decoder *)0x0) {
    return 0;
  }
  dec->status_ = VP8_STATUS_OK;
  dec->error_msg_ = "OK";
  if (io == (VP8Io *)0x0) {
    dec->status_ = VP8_STATUS_INVALID_PARAM;
    pcVar12 = "null VP8Io passed to VP8GetHeaders()";
  }
  else {
    uVar13 = io->data_size;
    if (uVar13 < 4) {
      dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
      pcVar12 = "Truncated header.";
    }
    else {
      puVar3 = (uint3 *)io->data;
      bVar2 = (byte)*puVar3;
      uVar4 = *puVar3;
      (dec->frm_hdr_).key_frame_ = bVar2 & 1 ^ 1;
      bVar16 = bVar2 >> 1 & 7;
      (dec->frm_hdr_).profile_ = bVar16;
      bVar14 = bVar2 >> 4 & 1;
      (dec->frm_hdr_).show_ = bVar14;
      uVar7 = (uint)(uVar4 >> 5);
      (dec->frm_hdr_).partition_length_ = uVar7;
      if (bVar16 < 4) {
        if (bVar14 == 0) {
          dec->status_ = VP8_STATUS_UNSUPPORTED_FEATURE;
          pcVar12 = "Frame not displayable.";
        }
        else {
          start = (byte *)((long)puVar3 + 3);
          uVar19 = uVar13 - 3;
          if ((bVar2 & 1) == 0) {
            if (uVar19 < 7) {
              dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
              pcVar12 = "cannot parse picture header";
            }
            else {
              if (((*start == 0x9d) && ((byte)puVar3[1] == 1)) &&
                 (*(byte *)((long)puVar3 + 5) == 0x2a)) {
                bVar2 = *(byte *)((long)puVar3 + 6);
                iVar15 = (*(byte *)((long)puVar3 + 7) & 0x3f) * 0x100;
                iVar10 = iVar15 + (uint)bVar2;
                (dec->pic_hdr_).width_ = (uint16_t)iVar10;
                (dec->pic_hdr_).xscale_ = *(byte *)((long)puVar3 + 7) >> 6;
                uVar4 = puVar3[2];
                iVar17 = (*(byte *)((long)puVar3 + 9) & 0x3f) * 0x100;
                iVar1 = iVar17 + (uint)(byte)uVar4;
                (dec->pic_hdr_).height_ = (uint16_t)iVar1;
                (dec->pic_hdr_).yscale_ = *(byte *)((long)puVar3 + 9) >> 6;
                start = (byte *)((long)puVar3 + 10);
                uVar19 = uVar13 - 10;
                dec->mb_w_ = iVar15 + (uint)bVar2 + 0xf >> 4;
                dec->mb_h_ = iVar17 + (uint)(byte)uVar4 + 0xf >> 4;
                io->width = iVar10;
                io->height = iVar1;
                io->use_cropping = 0;
                io->crop_left = 0;
                io->crop_top = 0;
                io->crop_right = iVar10;
                io->crop_bottom = iVar1;
                io->use_scaling = 0;
                io->scaled_width = iVar10;
                io->scaled_height = iVar1;
                io->mb_w = iVar10;
                io->mb_h = iVar1;
                VP8ResetProba(&dec->proba_);
                (dec->segment_hdr_).use_segment_ = 0;
                (dec->segment_hdr_).update_map_ = 0;
                (dec->segment_hdr_).absolute_delta_ = 1;
                (dec->segment_hdr_).quantizer_[0] = '\0';
                (dec->segment_hdr_).quantizer_[1] = '\0';
                (dec->segment_hdr_).quantizer_[2] = '\0';
                (dec->segment_hdr_).quantizer_[3] = '\0';
                (dec->segment_hdr_).filter_strength_[0] = '\0';
                (dec->segment_hdr_).filter_strength_[1] = '\0';
                (dec->segment_hdr_).filter_strength_[2] = '\0';
                (dec->segment_hdr_).filter_strength_[3] = '\0';
                uVar7 = (dec->frm_hdr_).partition_length_;
                goto LAB_0010ca75;
              }
              dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
              pcVar12 = "Bad code word";
            }
          }
          else {
LAB_0010ca75:
            if (uVar19 < uVar7) {
              if (dec->status_ != VP8_STATUS_OK) {
                return 0;
              }
              dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
              pcVar12 = "bad partition length";
            }
            else {
              br = &dec->br_;
              VP8InitBitReader(br,start,(ulong)uVar7);
              uVar13 = (ulong)(dec->frm_hdr_).partition_length_;
              if ((dec->frm_hdr_).key_frame_ != '\0') {
                uVar8 = VP8GetValue(br,1);
                (dec->pic_hdr_).colorspace_ = (uint8_t)uVar8;
                uVar8 = VP8GetValue(br,1);
                (dec->pic_hdr_).clamp_type_ = (uint8_t)uVar8;
              }
              uVar8 = VP8GetValue(br,1);
              (dec->segment_hdr_).use_segment_ = uVar8;
              if (uVar8 == 0) {
                (dec->segment_hdr_).update_map_ = 0;
              }
              else {
                uVar8 = VP8GetValue(br,1);
                (dec->segment_hdr_).update_map_ = uVar8;
                uVar8 = VP8GetValue(br,1);
                if (uVar8 != 0) {
                  uVar8 = VP8GetValue(br,1);
                  (dec->segment_hdr_).absolute_delta_ = uVar8;
                  lVar18 = 0;
                  do {
                    uVar8 = VP8GetValue(br,1);
                    if (uVar8 == 0) {
                      iVar5 = '\0';
                    }
                    else {
                      iVar9 = VP8GetSignedValue(br,7);
                      iVar5 = (int8_t)iVar9;
                    }
                    (dec->segment_hdr_).quantizer_[lVar18] = iVar5;
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 4);
                  lVar18 = 0;
                  do {
                    uVar8 = VP8GetValue(br,1);
                    if (uVar8 == 0) {
                      iVar5 = '\0';
                    }
                    else {
                      iVar9 = VP8GetSignedValue(br,6);
                      iVar5 = (int8_t)iVar9;
                    }
                    (dec->segment_hdr_).filter_strength_[lVar18] = iVar5;
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 4);
                }
                if ((dec->segment_hdr_).update_map_ != 0) {
                  lVar18 = -3;
                  do {
                    uVar8 = VP8GetValue(br,1);
                    if (uVar8 == 0) {
                      uVar6 = 0xff;
                    }
                    else {
                      uVar8 = VP8GetValue(br,8);
                      uVar6 = (uint8_t)uVar8;
                    }
                    (dec->proba_).bands_[0][0].probas_[0][lVar18] = uVar6;
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 0);
                }
              }
              if ((dec->br_).eof_ == 0) {
                iVar10 = ParseFilterHeader(br,dec);
                if (iVar10 == 0) {
                  if (dec->status_ != VP8_STATUS_OK) {
                    return 0;
                  }
                  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
                  pcVar12 = "cannot parse filter header";
                }
                else {
                  VVar11 = ParsePartitions(dec,start + uVar13,uVar19 - uVar13);
                  if (VVar11 == VP8_STATUS_OK) {
                    VP8ParseQuant(dec);
                    if ((dec->frm_hdr_).key_frame_ != '\0') {
                      iVar10 = 1;
                      VP8GetValue(br,1);
                      VP8ParseProba(br,dec);
                      goto LAB_0010c94a;
                    }
                    if (dec->status_ != VP8_STATUS_OK) {
                      return 0;
                    }
                    dec->status_ = VP8_STATUS_UNSUPPORTED_FEATURE;
                    pcVar12 = "Not a key frame.";
                  }
                  else {
                    if (dec->status_ != VP8_STATUS_OK) {
                      return 0;
                    }
                    dec->status_ = VVar11;
                    pcVar12 = "cannot parse partitions";
                  }
                }
              }
              else {
                if (dec->status_ != VP8_STATUS_OK) {
                  return 0;
                }
                dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
                pcVar12 = "cannot parse segment header";
              }
            }
          }
        }
      }
      else {
        dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
        pcVar12 = "Incorrect keyframe parameters.";
      }
    }
  }
  dec->error_msg_ = pcVar12;
  iVar10 = 0;
LAB_0010c94a:
  dec->ready_ = iVar10;
  return iVar10;
}

Assistant:

int VP8GetHeaders(VP8Decoder* const dec, VP8Io* const io) {
  const uint8_t* buf;
  size_t buf_size;
  VP8FrameHeader* frm_hdr;
  VP8PictureHeader* pic_hdr;
  VP8BitReader* br;
  VP8StatusCode status;

  if (dec == NULL) {
    return 0;
  }
  SetOk(dec);
  if (io == NULL) {
    return VP8SetError(dec, VP8_STATUS_INVALID_PARAM,
                       "null VP8Io passed to VP8GetHeaders()");
  }
  buf = io->data;
  buf_size = io->data_size;
  if (buf_size < 4) {
    return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                       "Truncated header.");
  }

  // Paragraph 9.1
  {
    const uint32_t bits = buf[0] | (buf[1] << 8) | (buf[2] << 16);
    frm_hdr = &dec->frm_hdr_;
    frm_hdr->key_frame_ = !(bits & 1);
    frm_hdr->profile_ = (bits >> 1) & 7;
    frm_hdr->show_ = (bits >> 4) & 1;
    frm_hdr->partition_length_ = (bits >> 5);
    if (frm_hdr->profile_ > 3) {
      return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                         "Incorrect keyframe parameters.");
    }
    if (!frm_hdr->show_) {
      return VP8SetError(dec, VP8_STATUS_UNSUPPORTED_FEATURE,
                         "Frame not displayable.");
    }
    buf += 3;
    buf_size -= 3;
  }

  pic_hdr = &dec->pic_hdr_;
  if (frm_hdr->key_frame_) {
    // Paragraph 9.2
    if (buf_size < 7) {
      return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                         "cannot parse picture header");
    }
    if (!VP8CheckSignature(buf, buf_size)) {
      return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                         "Bad code word");
    }
    pic_hdr->width_ = ((buf[4] << 8) | buf[3]) & 0x3fff;
    pic_hdr->xscale_ = buf[4] >> 6;   // ratio: 1, 5/4 5/3 or 2
    pic_hdr->height_ = ((buf[6] << 8) | buf[5]) & 0x3fff;
    pic_hdr->yscale_ = buf[6] >> 6;
    buf += 7;
    buf_size -= 7;

    dec->mb_w_ = (pic_hdr->width_ + 15) >> 4;
    dec->mb_h_ = (pic_hdr->height_ + 15) >> 4;

    // Setup default output area (can be later modified during io->setup())
    io->width = pic_hdr->width_;
    io->height = pic_hdr->height_;
    // IMPORTANT! use some sane dimensions in crop_* and scaled_* fields.
    // So they can be used interchangeably without always testing for
    // 'use_cropping'.
    io->use_cropping = 0;
    io->crop_top  = 0;
    io->crop_left = 0;
    io->crop_right  = io->width;
    io->crop_bottom = io->height;
    io->use_scaling  = 0;
    io->scaled_width = io->width;
    io->scaled_height = io->height;

    io->mb_w = io->width;   // for soundness
    io->mb_h = io->height;  // ditto

    VP8ResetProba(&dec->proba_);
    ResetSegmentHeader(&dec->segment_hdr_);
  }

  // Check if we have all the partition #0 available, and initialize dec->br_
  // to read this partition (and this partition only).
  if (frm_hdr->partition_length_ > buf_size) {
    return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                       "bad partition length");
  }

  br = &dec->br_;
  VP8InitBitReader(br, buf, frm_hdr->partition_length_);
  buf += frm_hdr->partition_length_;
  buf_size -= frm_hdr->partition_length_;

  if (frm_hdr->key_frame_) {
    pic_hdr->colorspace_ = VP8Get(br, "global-header");
    pic_hdr->clamp_type_ = VP8Get(br, "global-header");
  }
  if (!ParseSegmentHeader(br, &dec->segment_hdr_, &dec->proba_)) {
    return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                       "cannot parse segment header");
  }
  // Filter specs
  if (!ParseFilterHeader(br, dec)) {
    return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                       "cannot parse filter header");
  }
  status = ParsePartitions(dec, buf, buf_size);
  if (status != VP8_STATUS_OK) {
    return VP8SetError(dec, status, "cannot parse partitions");
  }

  // quantizer change
  VP8ParseQuant(dec);

  // Frame buffer marking
  if (!frm_hdr->key_frame_) {
    return VP8SetError(dec, VP8_STATUS_UNSUPPORTED_FEATURE,
                       "Not a key frame.");
  }

  VP8Get(br, "global-header");   // ignore the value of update_proba_

  VP8ParseProba(br, dec);

  // sanitized state
  dec->ready_ = 1;
  return 1;
}